

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.cpp
# Opt level: O2

void __thiscall
embree::avx::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleMi<4>_>::clear
          (BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleMi<4>_> *this)

{
  long lVar1;
  long *plVar2;
  void *ptr;
  size_t i;
  ulong uVar3;
  
  uVar3 = 0;
  while( true ) {
    lVar1 = *(long *)(*(long *)(this + 0x28) + 0x200);
    if ((ulong)(*(long *)(*(long *)(this + 0x28) + 0x208) - lVar1 >> 3) <= uVar3) break;
    plVar2 = *(long **)(lVar1 + uVar3 * 8);
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 0x28))();
    }
    uVar3 = uVar3 + 1;
  }
  uVar3 = 0;
  while( true ) {
    lVar1 = *(long *)(this + 0x10);
    if ((ulong)(*(long *)(this + 0x18) - lVar1 >> 3) <= uVar3) break;
    plVar2 = *(long **)(lVar1 + uVar3 * 8);
    if (plVar2 != (long *)0x0) {
      *(undefined8 *)(lVar1 + uVar3 * 8) = 0;
      (**(code **)(*plVar2 + 8))();
    }
    uVar3 = uVar3 + 1;
  }
  lVar1 = *(long *)(this + 0x50);
  ptr = *(void **)(this + 0x58);
  if (ptr != (void *)0x0) {
    if ((ulong)(lVar1 << 6) < 0x1c00000) {
      alignedFree(ptr);
    }
    else {
      os_free(ptr,lVar1 << 6,(bool)this[0x40]);
    }
  }
  if (lVar1 != 0) {
    (**(code **)**(undefined8 **)(this + 0x38))(*(undefined8 **)(this + 0x38),lVar1 * -0x40,1);
  }
  *(undefined8 *)(this + 0x48) = 0;
  *(undefined8 *)(this + 0x50) = 0;
  *(undefined8 *)(this + 0x58) = 0;
  return;
}

Assistant:

void BVHNBuilderTwoLevel<N,Mesh,Primitive>::clear()
    {
      for (size_t i=0; i<bvh->objects.size(); i++) 
        if (bvh->objects[i]) bvh->objects[i]->clear();

      for (size_t i=0; i<builders.size(); i++) 
        if (builders[i]) builders[i].reset();

      refs.clear();
    }